

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_extensions.cpp
# Opt level: O2

void duckdb::DuckDBExtensionsFun::RegisterFunction(BuiltinFunctions *set)

{
  TableFunctionSet functions;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_268;
  string local_250;
  FunctionSet<duckdb::TableFunction> local_230;
  FunctionSet<duckdb::TableFunction> local_1f8;
  TableFunction local_1c0;
  
  ::std::__cxx11::string::string((string *)&local_250,"duckdb_extensions",(allocator *)&local_268);
  TableFunctionSet::TableFunctionSet((TableFunctionSet *)&local_230,&local_250);
  ::std::__cxx11::string::~string((string *)&local_250);
  local_268.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1c0,(vector<duckdb::LogicalType,_true> *)&local_268,DuckDBExtensionsFunction,
             DuckDBExtensionsBind,DuckDBExtensionsInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&local_230.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,&local_1c0
            );
  TableFunction::~TableFunction(&local_1c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_268);
  FunctionSet<duckdb::TableFunction>::FunctionSet(&local_1f8,&local_230);
  BuiltinFunctions::AddFunction(set,(TableFunctionSet *)&local_1f8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_1f8);
  FunctionSet<duckdb::TableFunction>::~FunctionSet(&local_230);
  return;
}

Assistant:

void DuckDBExtensionsFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet functions("duckdb_extensions");
	functions.AddFunction(TableFunction({}, DuckDBExtensionsFunction, DuckDBExtensionsBind, DuckDBExtensionsInit));
	set.AddFunction(functions);
}